

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

LocaleHash __thiscall QMimeBinaryProvider::localeComments(QMimeBinaryProvider *this,QString *name)

{
  bool bVar1;
  Data *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QString *in_stack_000000e0;
  QMimeBinaryProvider *in_stack_000000e8;
  Data *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_10._M_node = (_Base_ptr)loadMimeTypeExtra(in_stack_000000e8,in_stack_000000e0);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
       ::cend((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
               *)in_RDI);
  bVar1 = std::operator!=(&local_10,&local_18);
  if (bVar1) {
    std::_Rb_tree_const_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>
                *)this_00);
    QHash<QString,_QString>::QHash
              ((QHash<QString,_QString> *)this_00,(QHash<QString,_QString> *)in_RDI);
  }
  else {
    memset(in_RDI,0,8);
    QHash<QString,_QString>::QHash((QHash<QString,_QString> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (LocaleHash)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QMimeTypePrivate::LocaleHash QMimeBinaryProvider::localeComments(const QString &name)
{
    MimeTypeExtraMap::const_iterator it = loadMimeTypeExtra(name);
    if (it != m_mimetypeExtra.cend())
        return it->second.localeComments;
    return {};
}